

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O0

value function_metadata(function_conflict func)

{
  value pvVar1;
  value pvVar2;
  value pvVar3;
  value pvVar4;
  value *ppvVar5;
  value *f_map;
  value f;
  value async;
  value sig;
  value name;
  value in_stack_00000040;
  size_t in_stack_ffffffffffffffc8;
  value *in_stack_ffffffffffffffd0;
  function_conflict in_stack_ffffffffffffffd8;
  
  pvVar1 = function_metadata_name(in_stack_ffffffffffffffd8);
  if (pvVar1 != (value)0x0) {
    pvVar2 = function_metadata_signature(in_stack_ffffffffffffffd8);
    if (pvVar2 != (value)0x0) {
      pvVar3 = function_metadata_async(in_stack_ffffffffffffffd8);
      if (pvVar3 != (value)0x0) {
        pvVar4 = value_create_map(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        if (pvVar4 != (value)0x0) {
          ppvVar5 = value_to_map((value)0x123681);
          *ppvVar5 = pvVar1;
          ppvVar5[1] = pvVar2;
          ppvVar5[2] = pvVar3;
          return pvVar4;
        }
        value_type_destroy(in_stack_00000040);
      }
      value_type_destroy(in_stack_00000040);
    }
    value_type_destroy(in_stack_00000040);
  }
  return (value)0x0;
}

Assistant:

value function_metadata(function func)
{
	value name, sig, async, f;
	value *f_map;

	/* Create function name array */
	name = function_metadata_name(func);

	if (name == NULL)
	{
		goto error_name;
	}

	/* Create signature array */
	sig = function_metadata_signature(func);

	if (sig == NULL)
	{
		goto error_signature;
	}

	/* Create function async array */
	async = function_metadata_async(func);

	if (async == NULL)
	{
		goto error_async;
	}

	/* Create function map (name + signature + async) */
	f = value_create_map(NULL, 3);

	if (f == NULL)
	{
		goto error_function;
	}

	f_map = value_to_map(f);

	f_map[0] = name;
	f_map[1] = sig;
	f_map[2] = async;

	return f;

error_function:
	value_type_destroy(async);
error_async:
	value_type_destroy(sig);
error_signature:
	value_type_destroy(name);
error_name:
	return NULL;
}